

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall mjs::parser::parse_primary_expression(parser *this)

{
  anon_class_24_3_2198c777_for__M_pred __pred;
  bool bVar1;
  token_type tVar2;
  reference pvVar3;
  iterator __first;
  wostream *pwVar4;
  syntax_node *this_00;
  source_extend *psVar5;
  size_type sVar6;
  const_reference pvVar7;
  socklen_t *in_RCX;
  char *__addr_len;
  parser *__addr_len_00;
  int __fd;
  parser *in_RSI;
  wchar_t *in_R9;
  undefined1 auVar8 [16];
  wstring_view wVar9;
  bool local_55c;
  bool local_559;
  bool local_54a;
  token local_528;
  token local_500;
  undefined1 local_4d1;
  undefined1 local_4d0 [48];
  wchar_t *local_4a0;
  undefined1 local_498 [24];
  size_type lit_end;
  wstring_view lit;
  mjs local_440 [16];
  wstring local_430;
  wostringstream local_410 [8];
  wostringstream _oss;
  __normal_iterator<mjs::property_name_and_value_*,_std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>_>
  local_270;
  __normal_iterator<mjs::property_name_and_value_*,_std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>_>
  it;
  __normal_iterator<mjs::property_name_and_value_*,_std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>_>
  local_260;
  __normal_iterator<mjs::property_name_and_value_*,_std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>_>
  e;
  wstring new_item_str;
  value_type *new_item;
  byte local_211;
  undefined1 local_210 [80];
  undefined1 local_1c0 [48];
  property_name_and_value_list elements_1;
  undefined1 local_178 [40];
  undefined1 local_150 [48];
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> local_120;
  undefined1 local_118 [40];
  undefined1 local_f0 [55];
  bool last_was_assignment_expression;
  vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  elements;
  undefined1 local_a0 [40];
  undefined1 local_78 [64];
  token id;
  parser *this_local;
  expression_ptr *e_1;
  
  __fd = (int)in_RSI;
  accept((parser *)(local_78 + 0x38),__fd,(sockaddr *)0x2,in_RCX);
  bVar1 = token::operator_cast_to_bool((token *)(local_78 + 0x38));
  if (bVar1) {
    token::text_abi_cxx11_((token *)(local_78 + 0x38));
    make_expression<mjs::identifier_expression,std::__cxx11::wstring_const&>
              (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                    in_RSI);
    local_78._40_4_ = es3;
  }
  else {
    accept((parser *)local_78,__fd,(sockaddr *)0x65,in_RCX);
    bVar1 = token::operator_cast_to_bool((token *)local_78);
    token::~token((token *)local_78);
    if (bVar1) {
      make_expression<mjs::this_expression>(this);
      local_78._40_4_ = es3;
    }
    else {
      __addr_len = (char *)(ulong)in_RSI->version_;
      elements.
      super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      local_54a = false;
      if (0 < (int)in_RSI->version_) {
        accept((parser *)local_a0,__fd,(sockaddr *)0x32,(socklen_t *)__addr_len);
        elements.
        super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        local_54a = token::operator_cast_to_bool((token *)local_a0);
      }
      if ((elements.
           super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        token::~token((token *)local_a0);
      }
      if (local_54a == false) {
        __addr_len_00 = (parser *)(ulong)in_RSI->version_;
        elements_1.
        super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        local_559 = false;
        if (0 < (int)in_RSI->version_) {
          accept((parser *)local_178,__fd,(sockaddr *)0x30,(socklen_t *)__addr_len_00);
          elements_1.
          super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          local_559 = token::operator_cast_to_bool((token *)local_178);
        }
        if ((elements_1.
             super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          token::~token((token *)local_178);
        }
        if (local_559 == false) {
          if (((int)in_RSI->version_ < 1) ||
             ((tVar2 = current_token_type(in_RSI), tVar2 != divide &&
              (tVar2 = current_token_type(in_RSI), tVar2 != divideequal)))) {
            accept((parser *)local_4d0,__fd,(sockaddr *)0x2e,(socklen_t *)__addr_len_00);
            bVar1 = token::operator_cast_to_bool((token *)local_4d0);
            token::~token((token *)local_4d0);
            if (bVar1) {
              local_4d1 = 0;
              parse_expression(this);
              expect(&local_500,in_RSI,rparen,"parse_primary_expression",0x218);
              token::~token(&local_500);
              local_78._40_4_ = es3;
              local_4d1 = 1;
            }
            else {
              tVar2 = current_token_type(in_RSI);
              bVar1 = is_literal(tVar2);
              if (bVar1) {
                check_literal(in_RSI);
                get_token(&local_528,in_RSI);
                make_expression<mjs::literal_expression,mjs::token>(this,(token *)in_RSI);
                token::~token(&local_528);
                local_78._40_4_ = es3;
              }
              else {
                local_78._40_4_ = es1;
              }
            }
          }
          else {
            wVar9 = lexer::get_regex_literal(&in_RSI->lexer_);
            lit._M_len = (size_t)wVar9._M_str;
            lit_end = wVar9._M_len;
            check_token(in_RSI);
            skip_whitespace(in_RSI);
            sVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&lit_end);
            if (sVar6 < 3) {
              __assert_fail("lit.size() >= 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                            ,0x211,"expression_ptr mjs::parser::parse_primary_expression()");
            }
            pvVar7 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                               ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&lit_end,0
                               );
            if (*pvVar7 != 0x2f) {
              __assert_fail("lit[0] == \'/\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                            ,0x212,"expression_ptr mjs::parser::parse_primary_expression()");
            }
            local_498._16_8_ =
                 std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::find_last_of
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&lit_end,L'/',
                            0xffffffffffffffff);
            if ((ulong)local_498._16_8_ < 2 || local_498._16_8_ == 0xffffffffffffffff) {
              __assert_fail("lit_end > 1 && lit_end != std::wstring_view::npos",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                            ,0x214,"expression_ptr mjs::parser::parse_primary_expression()");
            }
            local_498._0_16_ =
                 (undefined1  [16])
                 std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&lit_end,1,
                            local_498._16_8_ - 1);
            join_0x00000010_0x00000000_ =
                 std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&lit_end,
                            local_498._16_8_ + 1,0xffffffffffffffff);
            make_expression<mjs::regexp_literal_expression,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                      (this,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)in_RSI,
                       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_498);
            local_78._40_4_ = es3;
          }
        }
        else {
          std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
          vector((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                  *)(local_1c0 + 0x28));
          while( true ) {
            accept((parser *)local_1c0,__fd,(sockaddr *)0x31,(socklen_t *)__addr_len_00);
            bVar1 = token::operator_cast_to_bool((token *)local_1c0);
            token::~token((token *)local_1c0);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            bVar1 = std::
                    vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                    ::empty((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                             *)(local_1c0 + 0x28));
            if (!bVar1) {
              expect((token *)(local_210 + 0x28),in_RSI,comma,"parse_primary_expression",0x1e6);
              token::~token((token *)(local_210 + 0x28));
              __addr_len_00 = (parser *)(ulong)in_RSI->version_;
              local_211 = 0;
              local_55c = false;
              if (1 < (int)in_RSI->version_) {
                accept((parser *)local_210,__fd,(sockaddr *)0x31,(socklen_t *)__addr_len_00);
                local_211 = 1;
                local_55c = token::operator_cast_to_bool((token *)local_210);
              }
              if ((local_211 & 1) != 0) {
                token::~token((token *)local_210);
              }
              if (local_55c != false) break;
            }
            parse_property_name_and_value((property_name_and_value *)&new_item,in_RSI);
            std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
            ::push_back((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                         *)(local_1c0 + 0x28),(value_type *)&new_item);
            property_name_and_value::~property_name_and_value((property_name_and_value *)&new_item);
            if (1 < (int)in_RSI->version_) {
              pvVar3 = std::
                       vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                       ::back((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                               *)(local_1c0 + 0x28));
              property_name_and_value::name_str_abi_cxx11_((wstring *)&e,pvVar3);
              it._M_current =
                   (property_name_and_value *)
                   std::
                   vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                   ::end((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                          *)(local_1c0 + 0x28));
              local_260 = __gnu_cxx::
                          __normal_iterator<mjs::property_name_and_value_*,_std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>_>
                          ::operator-(&it,1);
              __first = std::
                        vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                        ::begin((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                 *)(local_1c0 + 0x28));
              __pred.new_item = pvVar3;
              __pred.new_item_str = (wstring *)&e;
              __pred.this = in_RSI;
              __addr_len_00 = in_RSI;
              local_270 = std::
                          find_if<__gnu_cxx::__normal_iterator<mjs::property_name_and_value*,std::vector<mjs::property_name_and_value,std::allocator<mjs::property_name_and_value>>>,mjs::parser::parse_primary_expression()::_lambda(mjs::property_name_and_value_const&)_1_>
                                    (__first._M_current,local_260,__pred);
              bVar1 = __gnu_cxx::operator!=(&local_270,&local_260);
              if (bVar1) {
                std::__cxx11::wostringstream::wostringstream(local_410);
                pwVar4 = std::operator<<((wostream *)local_410,
                                         "Invalid redefinition of property: \"");
                local_440 = (mjs  [16])
                            std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&e)
                ;
                cpp_quote_abi_cxx11_(&local_430,local_440,local_440._8_8_);
                pwVar4 = std::operator<<(pwVar4,(wstring *)&local_430);
                std::operator<<(pwVar4,"\"");
                std::__cxx11::wstring::~wstring((wstring *)&local_430);
                pvVar3 = std::
                         vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                         ::back((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                 *)(local_1c0 + 0x28));
                this_00 = &property_name_and_value::name(pvVar3)->super_syntax_node;
                psVar5 = syntax_node::extend(this_00);
                std::__cxx11::wostringstream::str();
                auVar8 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                                   ((wstring *)&lit._M_str);
                wVar9._M_str = in_R9;
                wVar9._M_len = auVar8._8_8_;
                syntax_error((parser *)"parse_primary_expression",(char *)0x207,(int)psVar5,
                             auVar8._0_8_,wVar9);
              }
              std::__cxx11::wstring::~wstring((wstring *)&e);
            }
          }
          make_expression<mjs::object_literal_expression,std::vector<mjs::property_name_and_value,std::allocator<mjs::property_name_and_value>>>
                    (this,(vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                           *)in_RSI);
          local_78._40_4_ = es3;
          std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
          ~vector((vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                   *)(local_1c0 + 0x28));
        }
      }
      else {
        std::
        vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ::vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                  *)(local_f0 + 0x30));
        local_f0[0x2f] = 0;
        while( true ) {
          accept((parser *)local_f0,__fd,(sockaddr *)0x33,(socklen_t *)__addr_len);
          bVar1 = token::operator_cast_to_bool((token *)local_f0);
          token::~token((token *)local_f0);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          accept((parser *)local_118,__fd,(sockaddr *)0x20,(socklen_t *)__addr_len);
          bVar1 = token::operator_cast_to_bool((token *)local_118);
          token::~token((token *)local_118);
          if (bVar1) {
            if ((local_f0[0x2f] & 1) == 0) {
              std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
              unique_ptr<std::default_delete<mjs::expression>,void>
                        ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)
                         &local_120,(nullptr_t)0x0);
              std::
              vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
              ::push_back((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                           *)(local_f0 + 0x30),(value_type *)&local_120);
              std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                        (&local_120);
            }
            local_f0[0x2f] = 0;
          }
          else {
            if ((local_f0[0x2f] & 1) != 0) {
              __addr_len = "parse_primary_expression";
              expect((token *)(local_150 + 8),in_RSI,comma,"parse_primary_expression",0x1da);
              token::~token((token *)(local_150 + 8));
            }
            parse_assignment_expression((parser *)local_150);
            std::
            vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
            ::push_back((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                         *)(local_f0 + 0x30),(value_type *)local_150);
            std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                      ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                       local_150);
            local_f0[0x2f] = 1;
          }
        }
        make_expression<mjs::array_literal_expression,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                  (this,(vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                         *)in_RSI);
        local_78._40_4_ = es3;
        std::
        vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                   *)(local_f0 + 0x30));
      }
    }
  }
  token::~token((token *)(local_78 + 0x38));
  if (local_78._40_4_ == es1) {
    unhandled(in_RSI,"parse_primary_expression",0x21e);
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_primary_expression() {
        // PrimaryExpression :
        //  this
        //  Identifier
        //  Literal
        //  ArrayLiteral
        //  ObjectLiteral
        //  ( Expression )
        if (auto id = accept(token_type::identifier)) {
            return make_expression<identifier_expression>(id.text());
        } else if (accept(token_type::this_)) {
            return make_expression<this_expression>();
        } else if (version_ >= version::es3 && accept(token_type::lbracket)) {
            // ArrayLiteral
            std::vector<expression_ptr> elements;
            bool last_was_assignment_expression = false;
            while (!accept(token_type::rbracket)) {
                if (accept(token_type::comma)) {
                    if (!last_was_assignment_expression) {
                        elements.push_back(nullptr);
                    }
                    last_was_assignment_expression = false;
                } else {
                    if (last_was_assignment_expression) {
                        EXPECT(token_type::comma);
                    }
                    elements.push_back(parse_assignment_expression());
                    last_was_assignment_expression = true;
                }
            }
            return make_expression<array_literal_expression>(std::move(elements));
        } else if (version_ >= version::es3 && accept(token_type::lbrace)) {
            // ObjectLiteral
            property_name_and_value_list elements;
            while (!accept(token_type::rbrace)) {
                if (!elements.empty()) {
                    EXPECT(token_type::comma);
                    if (version_ >= version::es5 && accept(token_type::rbrace)) {
                        // Trailing comma allowed in ES5+
                        break;
                    }
                }
                elements.push_back(parse_property_name_and_value());
                if (version_ >= version::es5) {
                    const auto& new_item = elements.back();
                    const auto new_item_str = new_item.name_str();
                    auto e = elements.end() - 1;
                    auto it = std::find_if(elements.begin(), e, [&](const property_name_and_value& v) {
                        if (v.name_str() != new_item_str) {
                            // Item doesn't match
                            return false;
                        }
                        // Repeated definitions are not allowed for data properties in strict mode
                        if (new_item.type() == property_assignment_type::normal && v.type() == property_assignment_type::normal) {
                            return strict_mode_;
                        }
                        // May not change a data property to an accessor property or vice versa
                        if (new_item.type() == property_assignment_type::normal && v.type() != property_assignment_type::normal) {
                            return true;
                        }
                        if (new_item.type() != property_assignment_type::normal && v.type() == property_assignment_type::normal) {
                            return true;
                        }
                        // May only define getter/setter once
                        assert(new_item.type() == property_assignment_type::get || new_item.type() == property_assignment_type::set);
                        assert(v.type() == property_assignment_type::get || v.type() == property_assignment_type::set);
                        return new_item.type() == v.type();
                    });
                    if (it != e) {
                        SYNTAX_ERROR_AT("Invalid redefinition of property: \"" << cpp_quote(new_item_str) << "\"", elements.back().name().extend());
                    }
                }
            }
            return make_expression<object_literal_expression>(std::move(elements));
        } else if (version_ >= version::es3 && (current_token_type() == token_type::divide || current_token_type() == token_type::divideequal)) {
            // RegularExpressionLiteral
            const auto lit = lexer_.get_regex_literal();
            check_token();
            skip_whitespace();
            assert(lit.size() >= 3);
            assert(lit[0] == '/');
            const auto lit_end = lit.find_last_of('/');
            assert(lit_end > 1 && lit_end != std::wstring_view::npos);
            return make_expression<regexp_literal_expression>(lit.substr(1, lit_end-1), lit.substr(lit_end+1));
        } else if (accept(token_type::lparen)) {
            auto e = parse_expression();
            EXPECT(token_type::rparen);
            return e;
        } else if (is_literal(current_token_type())) {
            check_literal();
            return make_expression<literal_expression>(get_token());
        }
        UNHANDLED();
    }